

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check.h
# Opt level: O1

void __thiscall
mp::
SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::Gen1Viol(SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,ViolSummary *vs,MemoryWriter *wrt,bool f_max,string *type)

{
  string vmaxabs;
  string vmaxrel;
  string local_78;
  pointer local_58;
  size_type sStack_50;
  string local_40;
  
  if (vs->N_ != 0) {
    local_78._M_dataplus._M_p = (type->_M_dataplus)._M_p;
    local_78._M_string_length = type->_M_string_length;
    fmt::BasicWriter<char>::write
              (&wrt->super_BasicWriter<char>,0x380673,(void *)0xb,(size_t)&local_78);
    SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
    ::Gen1ViolMax_abi_cxx11_(&local_78,this,f_max,vs->epsAbsMax_,vs->nameAbs_);
    SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
    ::Gen1ViolMax_abi_cxx11_(&local_40,this,f_max,vs->epsRelMax_,vs->nameRel_);
    local_58 = local_78._M_dataplus._M_p;
    sStack_50 = local_78._M_string_length;
    fmt::BasicWriter<char>::write
              (&wrt->super_BasicWriter<char>,0x38067b,(void *)0xb,(size_t)&local_58);
    local_58 = local_40._M_dataplus._M_p;
    sStack_50 = local_40._M_string_length;
    fmt::BasicWriter<char>::write
              (&wrt->super_BasicWriter<char>,0x38067b,(void *)0xb,(size_t)&local_58);
    local_58 = (pointer)0x0;
    sStack_50 = 0;
    fmt::BasicWriter<char>::write
              (&wrt->super_BasicWriter<char>,0x38f4f3,(void *)0x0,(size_t)&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void Gen1Viol(
      const ViolSummary& vs, fmt::MemoryWriter& wrt,
      bool f_max, const std::string& type) {
    if (vs.N_) {
      // wrt.write("  {:16} {:<7}", type, vs.N_);
      wrt.write("  {:27}", type);
      auto vmaxabs = Gen1ViolMax(  // true: 1 for logical
            f_max, vs.epsAbsMax_, vs.nameAbs_);
      auto vmaxrel = Gen1ViolMax(
            f_max, vs.epsRelMax_, vs.nameRel_);
      wrt.write("  {:14}", vmaxabs);
      wrt.write("  {:14}", vmaxrel);
      wrt.write("\n");
    }
  }